

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_player_prop_type(parser *p)

{
  embryo_player_ability *peVar1;
  char *pcVar2;
  void *pvVar3;
  embryo_player_ability *v;
  embryo_player_ability *embryo;
  embryo_player_ability *h;
  char *type;
  parser *p_local;
  
  pcVar2 = parser_getstr(p,"type");
  pvVar3 = parser_priv(p);
  v = (embryo_player_ability *)mem_zalloc(0x40);
  peVar1 = v;
  if (pvVar3 != (void *)0x0) {
    *(embryo_player_ability **)((long)pvVar3 + 0x38) = v;
    peVar1 = embryo_player_abilities;
  }
  embryo_player_abilities = peVar1;
  parser_setpriv(p,v);
  pcVar2 = string_make(pcVar2);
  (v->ability).type = pcVar2;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_player_prop_type(struct parser *p) {
	const char *type = parser_getstr(p, "type");
	struct embryo_player_ability *h = parser_priv(p);
	struct embryo_player_ability *embryo = mem_zalloc(sizeof *embryo);

	if (h) {
		h->next = embryo;
	} else {
		embryo_player_abilities = embryo;
	}
	parser_setpriv(p, embryo);
	embryo->ability.type = string_make(type);
	return PARSE_ERROR_NONE;
}